

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillScratchGpRegsBeforeEntry
          (RALocalAllocator *this,RegMask scratchRegs)

{
  bool bVar1;
  uint32_t physId;
  uint32_t workId;
  Error EVar2;
  BitWordIterator<unsigned_int> it;
  RegMask local_2c;
  
  local_2c = scratchRegs;
  do {
    do {
      if (local_2c == 0) {
        return 0;
      }
      physId = Support::BitWordIterator<unsigned_int>::next
                         ((BitWordIterator<unsigned_int> *)&local_2c);
      bVar1 = RAAssignment::isPhysAssigned(&this->_curAssignment,k0,physId);
    } while (!bVar1);
    workId = RAAssignment::physToWorkId(&this->_curAssignment,k0,physId);
    EVar2 = onSpillReg(this,k0,workId,physId);
  } while (EVar2 == 0);
  return EVar2;
}

Assistant:

Error RALocalAllocator::spillScratchGpRegsBeforeEntry(RegMask scratchRegs) noexcept {
  RegGroup group = RegGroup::kGp;
  Support::BitWordIterator<RegMask> it(scratchRegs);

  while (it.hasNext()) {
    uint32_t physId = it.next();
    if (_curAssignment.isPhysAssigned(group, physId)) {
      uint32_t workId = _curAssignment.physToWorkId(group, physId);
      ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
    }
  }

  return kErrorOk;
}